

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_347e::ProfileDataTest::ExpectRunningSamples(ProfileDataTest *this,int samples)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_4a0;
  Message local_498;
  undefined1 local_490 [8];
  AssertionResult gtest_ar;
  AssertHelper local_460 [3];
  Message local_448;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_;
  State state;
  int samples_local;
  ProfileDataTest *this_local;
  
  state._1044_4_ = samples;
  ProfileData::GetCurrentState(&this->collector_,(State *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_440,(bool *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_448);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_440,(AssertionResult *)"state.enabled"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x13f,pcVar2);
    testing::internal::AssertHelper::operator=(local_460,&local_448);
    testing::internal::AssertHelper::~AssertHelper(local_460);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_490,"samples","state.samples_gathered",(int *)&state.field_0x414,
             (int *)(state.profile_name + 0x3f8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x140,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  return;
}

Assistant:

void ExpectRunningSamples(int samples) {
    ProfileData::State state;
    collector_.GetCurrentState(&state);
    EXPECT_TRUE(state.enabled);
    EXPECT_EQ(samples, state.samples_gathered);
  }